

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_horiz_rs_sse4.c
# Opt level: O2

void av1_highbd_convolve_horiz_rs_sse4_1
               (uint16_t *src,int src_stride,uint16_t *dst,int dst_stride,int w,int h,
               int16_t *x_filters,int x0_qn,int x_step_qn,int bd)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  short sVar5;
  short sVar6;
  uint uVar7;
  uint16_t *puVar8;
  int iVar9;
  uint uVar10;
  uint16_t *puVar11;
  int x_qn;
  long lVar12;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar15 [16];
  short sVar16;
  short sVar18;
  short sVar19;
  short sVar20;
  undefined1 auVar17 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  
  auVar14 = ZEXT416((uint)~(-1 << ((byte)bd & 0x1f)));
  auVar14 = pshuflw(auVar14,auVar14,0);
  lVar12 = 0;
  if (h < 1) {
    h = 0;
  }
  auVar15 = pmovsxbd(in_XMM1,0x40404040);
  for (; lVar12 < w; lVar12 = lVar12 + 4) {
    uVar7 = x_step_qn * 2 + x0_qn;
    uVar10 = x_step_qn * 3 + x0_qn;
    auVar1 = *(undefined1 (*) [16])((long)x_filters + (ulong)((uint)x0_qn >> 4 & 0x3f0));
    auVar2 = *(undefined1 (*) [16])
              ((long)x_filters + (ulong)((uint)(x_step_qn + x0_qn) >> 4 & 0x3f0));
    auVar3 = *(undefined1 (*) [16])((long)x_filters + (ulong)(uVar7 >> 4 & 0x3f0));
    auVar4 = *(undefined1 (*) [16])((long)x_filters + (ulong)(uVar10 >> 4 & 0x3f0));
    puVar8 = dst;
    puVar11 = src + -3;
    iVar9 = h;
    while (bVar13 = iVar9 != 0, iVar9 = iVar9 + -1, bVar13) {
      auVar17 = pmaddwd(*(undefined1 (*) [16])(puVar11 + (x0_qn >> 0xe)),auVar1);
      auVar21 = pmaddwd(*(undefined1 (*) [16])(puVar11 + (x_step_qn + x0_qn >> 0xe)),auVar2);
      auVar17 = phaddd(auVar17,auVar21);
      auVar21 = pmaddwd(*(undefined1 (*) [16])(puVar11 + ((int)uVar7 >> 0xe)),auVar3);
      auVar22 = pmaddwd(*(undefined1 (*) [16])(puVar11 + ((int)uVar10 >> 0xe)),auVar4);
      auVar21 = phaddd(auVar21,auVar22);
      auVar17 = phaddd(auVar17,auVar21);
      auVar21._0_4_ = auVar17._0_4_ + auVar15._0_4_ >> 7;
      auVar21._4_4_ = auVar17._4_4_ + auVar15._4_4_ >> 7;
      auVar21._8_4_ = auVar17._8_4_ + auVar15._8_4_ >> 7;
      auVar21._12_4_ = auVar17._12_4_ + auVar15._12_4_ >> 7;
      auVar17 = packusdw(auVar21,(undefined1  [16])0x0);
      sVar5 = auVar14._0_2_;
      sVar16 = auVar17._0_2_;
      sVar6 = auVar14._2_2_;
      sVar18 = auVar17._2_2_;
      sVar19 = auVar17._4_2_;
      sVar20 = auVar17._6_2_;
      *(ulong *)puVar8 =
           CONCAT26((ushort)(sVar6 < sVar20) * sVar6 | (ushort)(sVar6 >= sVar20) * sVar20,
                    CONCAT24((ushort)(sVar5 < sVar19) * sVar5 | (ushort)(sVar5 >= sVar19) * sVar19,
                             CONCAT22((ushort)(sVar6 < sVar18) * sVar6 |
                                      (ushort)(sVar6 >= sVar18) * sVar18,
                                      (ushort)(sVar5 < sVar16) * sVar5 |
                                      (ushort)(sVar5 >= sVar16) * sVar16)));
      puVar8 = puVar8 + dst_stride;
      puVar11 = puVar11 + src_stride;
    }
    x0_qn = x0_qn + x_step_qn * 4;
    dst = dst + 4;
  }
  return;
}

Assistant:

void av1_highbd_convolve_horiz_rs_sse4_1(const uint16_t *src, int src_stride,
                                         uint16_t *dst, int dst_stride, int w,
                                         int h, const int16_t *x_filters,
                                         int x0_qn, int x_step_qn, int bd) {
  assert(UPSCALE_NORMATIVE_TAPS == 8);
  assert(bd == 8 || bd == 10 || bd == 12);

  src -= UPSCALE_NORMATIVE_TAPS / 2 - 1;

  const __m128i round_add = _mm_set1_epi32((1 << FILTER_BITS) >> 1);
  const __m128i zero = _mm_setzero_si128();
  const __m128i clip_maximum = _mm_set1_epi16((1 << bd) - 1);

  const uint16_t *src_y;
  uint16_t *dst_y;
  int x_qn = x0_qn;
  for (int x = 0; x < w; x += 4, x_qn += 4 * x_step_qn) {
    const int x_filter_idx0 =
        ((x_qn + 0 * x_step_qn) & RS_SCALE_SUBPEL_MASK) >> RS_SCALE_EXTRA_BITS;
    const int x_filter_idx1 =
        ((x_qn + 1 * x_step_qn) & RS_SCALE_SUBPEL_MASK) >> RS_SCALE_EXTRA_BITS;
    const int x_filter_idx2 =
        ((x_qn + 2 * x_step_qn) & RS_SCALE_SUBPEL_MASK) >> RS_SCALE_EXTRA_BITS;
    const int x_filter_idx3 =
        ((x_qn + 3 * x_step_qn) & RS_SCALE_SUBPEL_MASK) >> RS_SCALE_EXTRA_BITS;

    assert(x_filter_idx0 <= RS_SUBPEL_MASK);
    assert(x_filter_idx1 <= RS_SUBPEL_MASK);
    assert(x_filter_idx2 <= RS_SUBPEL_MASK);
    assert(x_filter_idx3 <= RS_SUBPEL_MASK);

    const int16_t *const x_filter0 =
        &x_filters[x_filter_idx0 * UPSCALE_NORMATIVE_TAPS];
    const int16_t *const x_filter1 =
        &x_filters[x_filter_idx1 * UPSCALE_NORMATIVE_TAPS];
    const int16_t *const x_filter2 =
        &x_filters[x_filter_idx2 * UPSCALE_NORMATIVE_TAPS];
    const int16_t *const x_filter3 =
        &x_filters[x_filter_idx3 * UPSCALE_NORMATIVE_TAPS];

    const __m128i fil0_16 = xx_loadu_128(x_filter0);
    const __m128i fil1_16 = xx_loadu_128(x_filter1);
    const __m128i fil2_16 = xx_loadu_128(x_filter2);
    const __m128i fil3_16 = xx_loadu_128(x_filter3);

    src_y = src;
    dst_y = dst;
    for (int y = 0; y < h; y++, src_y += src_stride, dst_y += dst_stride) {
      const uint16_t *const src_x0 =
          &src_y[(x_qn + 0 * x_step_qn) >> RS_SCALE_SUBPEL_BITS];
      const uint16_t *const src_x1 =
          &src_y[(x_qn + 1 * x_step_qn) >> RS_SCALE_SUBPEL_BITS];
      const uint16_t *const src_x2 =
          &src_y[(x_qn + 2 * x_step_qn) >> RS_SCALE_SUBPEL_BITS];
      const uint16_t *const src_x3 =
          &src_y[(x_qn + 3 * x_step_qn) >> RS_SCALE_SUBPEL_BITS];

      // Load up the source data. This is 16-bit input data, so each load
      // gets 8 pixels.
      const __m128i src0_16 = xx_loadu_128(src_x0);
      const __m128i src1_16 = xx_loadu_128(src_x1);
      const __m128i src2_16 = xx_loadu_128(src_x2);
      const __m128i src3_16 = xx_loadu_128(src_x3);

      // Multiply by filter coefficients (results in a 32-bit value),
      // and add adjacent pairs, i.e.
      // ([ s7 s6 s5 s4 s3 s2 s1 s0], [ f7 f6 f5 f4 f3 f2 f1 f0 ])
      // -> [ {s7*f7+s6*f6} {s5*f5+s4*f4} {s3*f3+s2*f2} {s1*f1+s0*f0} ]
      const __m128i conv0_32 = _mm_madd_epi16(src0_16, fil0_16);
      const __m128i conv1_32 = _mm_madd_epi16(src1_16, fil1_16);
      const __m128i conv2_32 = _mm_madd_epi16(src2_16, fil2_16);
      const __m128i conv3_32 = _mm_madd_epi16(src3_16, fil3_16);

      // Reduce horizontally and add, i.e.
      // ([ D C B A ], [ S R Q P ]) -> [ S+R Q+P D+C B+A ]
      const __m128i conv01_32 = _mm_hadd_epi32(conv0_32, conv1_32);
      const __m128i conv23_32 = _mm_hadd_epi32(conv2_32, conv3_32);

      const __m128i conv0123_32 = _mm_hadd_epi32(conv01_32, conv23_32);

      // Divide down by (1 << FILTER_BITS), rounding to nearest.
      const __m128i shifted_32 =
          _mm_srai_epi32(_mm_add_epi32(conv0123_32, round_add), FILTER_BITS);

      // Pack 32-bit values into 16-bit values, i.e.
      // ([ D C B A ], [ 0 0 0 0 ]) -> [ 0 0 0 0 D C B A ]
      const __m128i shifted_16 = _mm_packus_epi32(shifted_32, zero);

      // Clip the values at (1 << bd) - 1
      const __m128i clipped_16 = _mm_min_epi16(shifted_16, clip_maximum);

      // Write to the output
      xx_storel_64(&dst_y[x], clipped_16);
    }
  }
}